

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::FindPlatformMonitorForRect(ImRect *rect)

{
  int iVar1;
  ImGuiContext_conflict *pIVar2;
  _Bool _Var3;
  ImVec2 lhs;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auStack_68 [4];
  float overlapping_surface;
  ImRect overlapping_rect;
  undefined1 local_50 [8];
  ImRect monitor_rect;
  ImGuiPlatformMonitor *monitor;
  float local_30;
  int monitor_n;
  float best_monitor_surface;
  int best_monitor_n;
  float surface_threshold;
  int monitor_count;
  ImGuiContext_conflict *g;
  ImRect *rect_local;
  
  pIVar2 = GImGui;
  iVar1 = (GImGui->PlatformIO).Monitors.Size;
  if (iVar1 < 2) {
    rect_local._4_4_ = iVar1 + -1;
  }
  else {
    fVar4 = ImRect::GetWidth(rect);
    fVar5 = ImRect::GetHeight(rect);
    fVar4 = ImMax<float>(fVar4 * fVar5 * 0.5,1.0);
    monitor_n = -1;
    local_30 = 0.001;
    for (monitor._4_4_ = 0; monitor._4_4_ < (pIVar2->PlatformIO).Monitors.Size && local_30 < fVar4;
        monitor._4_4_ = monitor._4_4_ + 1) {
      lhs = (ImVec2)ImVector<ImGuiPlatformMonitor>::operator[]
                              (&(pIVar2->PlatformIO).Monitors,monitor._4_4_);
      monitor_rect.Max = lhs;
      overlapping_rect.Max = operator+((ImVec2 *)lhs,(ImVec2 *)((long)lhs + 8));
      ImRect::ImRect((ImRect *)local_50,(ImVec2 *)lhs,&overlapping_rect.Max);
      _Var3 = ImRect::Contains((ImRect *)local_50,rect);
      if (_Var3) {
        return monitor._4_4_;
      }
      _auStack_68 = rect->Min;
      overlapping_rect.Min = rect->Max;
      ImRect::ClipWithFull((ImRect *)auStack_68,(ImRect *)local_50);
      fVar5 = ImRect::GetWidth((ImRect *)auStack_68);
      fVar6 = ImRect::GetHeight((ImRect *)auStack_68);
      if (local_30 <= fVar5 * fVar6) {
        monitor_n = monitor._4_4_;
        local_30 = fVar5 * fVar6;
      }
    }
    rect_local._4_4_ = monitor_n;
  }
  return rect_local._4_4_;
}

Assistant:

static int ImGui::FindPlatformMonitorForRect(const ImRect& rect)
{
    ImGuiContext& g = *GImGui;

    const int monitor_count = g.PlatformIO.Monitors.Size;
    if (monitor_count <= 1)
        return monitor_count - 1;

    // Use a minimum threshold of 1.0f so a zero-sized rect won't false positive, and will still find the correct monitor given its position.
    // This is necessary for tooltips which always resize down to zero at first.
    const float surface_threshold = ImMax(rect.GetWidth() * rect.GetHeight() * 0.5f, 1.0f);
    int best_monitor_n = -1;
    float best_monitor_surface = 0.001f;

    for (int monitor_n = 0; monitor_n < g.PlatformIO.Monitors.Size && best_monitor_surface < surface_threshold; monitor_n++)
    {
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[monitor_n];
        const ImRect monitor_rect = ImRect(monitor.MainPos, monitor.MainPos + monitor.MainSize);
        if (monitor_rect.Contains(rect))
            return monitor_n;
        ImRect overlapping_rect = rect;
        overlapping_rect.ClipWithFull(monitor_rect);
        float overlapping_surface = overlapping_rect.GetWidth() * overlapping_rect.GetHeight();
        if (overlapping_surface < best_monitor_surface)
            continue;
        best_monitor_surface = overlapping_surface;
        best_monitor_n = monitor_n;
    }
    return best_monitor_n;
}